

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug operator<<(QDebug debug,QKeyCombination combination)

{
  Stream *pSVar1;
  QDebug *pQVar2;
  undefined4 in_register_00000034;
  QDebug *this;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  this = (QDebug *)CONCAT44(in_register_00000034,combination.combination);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,this);
  this->stream[0x30] = (Stream)0x0;
  pQVar2 = QDebug::operator<<(this,"QKeyCombination(");
  local_60.stream = pQVar2->stream;
  *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
  operator<<<QFlags<Qt::KeyboardModifier>,_true>
            ((Stream *)local_58,(QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(&local_60,0));
  pQVar2 = QDebug::operator<<((QDebug *)local_58,", ");
  local_50.stream = pQVar2->stream;
  *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
  operator<<((Stream *)local_48,(Key)&local_50);
  QDebug::operator<<((QDebug *)local_48,")");
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug(&local_50);
  QDebug::~QDebug((QDebug *)local_58);
  QDebug::~QDebug(&local_60);
  pSVar1 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug debug, QKeyCombination combination)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QKeyCombination("
                    << combination.keyboardModifiers()
                    << ", "
                    << combination.key()
                    << ")";
    return debug;
}